

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::string_t,double,double,duckdb::TernaryLambdaWrapper,double(*)(duckdb::string_t_const&,duckdb::string_t_const&,double_const&)>
               (string_t *adata,string_t *bdata,double *cdata,double *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_double_string_t_ptr_string_t_ptr_double_ptr *fun)

{
  string_t *psVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t i;
  ulong uVar7;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t row_idx_01;
  idx_t i_1;
  idx_t row_idx_02;
  double local_78;
  string_t *local_70;
  string_t *local_68;
  double *local_60;
  double *local_58;
  anon_union_16_2_67f50693_for_value local_50;
  anon_union_16_2_67f50693_for_value local_40;
  
  local_70 = adata;
  local_68 = bdata;
  local_60 = cdata;
  local_58 = result_data;
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
      uVar4 = uVar7;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)asel->sel_vector[uVar7];
      }
      uVar5 = uVar7;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)bsel->sel_vector[uVar7];
      }
      uVar6 = uVar7;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)csel->sel_vector[uVar7];
      }
      psVar1 = local_70 + uVar4;
      local_40.pointer.length = (psVar1->value).pointer.length;
      local_40.pointer.prefix = *(char (*) [4])((long)&psVar1->value + 4);
      local_40._8_4_ = *(undefined4 *)((long)&psVar1->value + 8);
      local_40._12_4_ = *(undefined4 *)((long)&psVar1->value + 0xc);
      psVar1 = local_68 + uVar5;
      local_50.pointer.length = (psVar1->value).pointer.length;
      local_50.pointer.prefix = *(char (*) [4])((long)&psVar1->value + 4);
      local_50._8_4_ = *(undefined4 *)((long)&psVar1->value + 8);
      local_50._12_4_ = *(undefined4 *)((long)&psVar1->value + 0xc);
      local_78 = local_60[uVar6];
      dVar2 = (*fun)((string_t *)&local_40.pointer,(string_t *)&local_50.pointer,&local_78);
      local_58[uVar7] = dVar2;
    }
  }
  else {
    for (row_idx_02 = 0; count != row_idx_02; row_idx_02 = row_idx_02 + 1) {
      row_idx_00 = row_idx_02;
      if (asel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)asel->sel_vector[row_idx_02];
      }
      row_idx_01 = row_idx_02;
      if (bsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)bsel->sel_vector[row_idx_02];
      }
      row_idx = row_idx_02;
      if (csel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)csel->sel_vector[row_idx_02];
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar3) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar3) goto LAB_00d67016;
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar3) goto LAB_00d67016;
        psVar1 = local_70 + row_idx_00;
        local_40.pointer.length = (psVar1->value).pointer.length;
        local_40.pointer.prefix = *(char (*) [4])((long)&psVar1->value + 4);
        local_40._8_4_ = *(undefined4 *)((long)&psVar1->value + 8);
        local_40._12_4_ = *(undefined4 *)((long)&psVar1->value + 0xc);
        psVar1 = local_68 + row_idx_01;
        local_50.pointer.length = (psVar1->value).pointer.length;
        local_50.pointer.prefix = *(char (*) [4])((long)&psVar1->value + 4);
        local_50._8_4_ = *(undefined4 *)((long)&psVar1->value + 8);
        local_50._12_4_ = *(undefined4 *)((long)&psVar1->value + 0xc);
        local_78 = local_60[row_idx];
        dVar2 = (*fun)((string_t *)&local_40.pointer,(string_t *)&local_50.pointer,&local_78);
        local_58[row_idx_02] = dVar2;
      }
      else {
LAB_00d67016:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_02);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}